

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O0

_Bool check_crc(uint8_t *S,uint8_t *buf,uint32_t len,uint8_t *IV)

{
  long *local_38;
  uint8_t *c;
  uint8_t *puStack_28;
  uint32_t crc;
  uint8_t *IV_local;
  long *plStack_18;
  uint32_t len_local;
  uint8_t *buf_local;
  uint8_t *S_local;
  
  c._4_4_ = 0;
  puStack_28 = IV;
  IV_local._4_4_ = len;
  plStack_18 = (long *)buf;
  buf_local = S;
  if ((IV != (uint8_t *)0x0) && (*(long *)S == *(long *)IV)) {
    crc_update((uint32_t *)((long)&c + 4),"\x01");
    crc_update((uint32_t *)((long)&c + 4),"");
  }
  for (local_38 = plStack_18; local_38 < (long *)((long)plStack_18 + (ulong)IV_local._4_4_);
      local_38 = local_38 + 1) {
    if (*(long *)buf_local == *local_38) {
      crc_update((uint32_t *)((long)&c + 4),"\x01");
      crc_update((uint32_t *)((long)&c + 4),"");
    }
    else {
      crc_update((uint32_t *)((long)&c + 4),"");
      crc_update((uint32_t *)((long)&c + 4),"");
    }
  }
  return c._4_4_ == 0;
}

Assistant:

static bool check_crc(const uint8_t *S, const uint8_t *buf,
                      uint32_t len, const uint8_t *IV)
{
    uint32_t crc;
    const uint8_t *c;

    crc = 0;
    if (IV && !CMP(S, IV)) {
        crc_update(&crc, ONE);
        crc_update(&crc, ZERO);
    }
    for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
        if (!CMP(S, c)) {
            crc_update(&crc, ONE);
            crc_update(&crc, ZERO);
        } else {
            crc_update(&crc, ZERO);
            crc_update(&crc, ZERO);
        }
    }
    return (crc == 0);
}